

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O2

int recvsimplehttpresp(SOCKET sock,int *pStatus,char **pszStatus,char **pContentType,
                      int *pContentLength,char **pContent,int maxrecvbuflen,int *pBytesReceived)

{
  uint recvbuflen;
  char **ppcVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __n;
  char **ppcVar8;
  int count;
  char **local_68;
  char **local_60;
  SOCKET local_54;
  char *ptr2;
  char **local_48;
  uint *local_40;
  double httpver;
  
  ptr2 = (char *)0x0;
  count = 0;
  httpver = 0.0;
  *pStatus = 0;
  *pszStatus = (char *)0x0;
  *pContentType = (char *)0x0;
  *pContentLength = 0;
  *pContent = (char *)0x0;
  *pBytesReceived = 0;
  local_68 = pContentType;
  local_60 = pszStatus;
  local_48 = pContent;
  local_40 = (uint *)pContentLength;
  pcVar5 = (char *)calloc((long)(maxrecvbuflen + 1),1);
  iVar4 = 6;
  if (pcVar5 == (char *)0x0) {
    return 6;
  }
  iVar3 = recvuntilstr(sock,pcVar5,"\r\n\r\n",maxrecvbuflen,pBytesReceived);
  if (iVar3 != 0) {
    free(pcVar5);
    return iVar3;
  }
  local_54 = sock;
  pcVar6 = strstr(pcVar5,"HTTP/");
  if (pcVar6 != (char *)0x0) {
    pcVar7 = (char *)calloc(0x100,1);
    ppcVar8 = local_60;
    *local_60 = pcVar7;
    if (pcVar7 == (char *)0x0) {
LAB_00148280:
      free(pcVar5);
      return iVar4;
    }
    iVar3 = __isoc99_sscanf(pcVar6,"HTTP/%lf %d %[^\r\n]255s",&httpver,pStatus,pcVar7);
    if ((iVar3 == 3) &&
       (pcVar6 = strstrbeginend(pcVar6,"Content-Type: ","\r\n",&ptr2,&count), pcVar6 != (char *)0x0)
       ) {
      __n = (size_t)count;
      pcVar6 = (char *)calloc(__n + 1,1);
      *local_68 = pcVar6;
      if (pcVar6 == (char *)0x0) {
        free(*local_60);
        goto LAB_00148280;
      }
      memcpy(pcVar6,ptr2,__n);
      pcVar7 = strstr(pcVar5,"Content-Length: ");
      puVar2 = local_40;
      if (pcVar7 == (char *)0x0) {
        free(pcVar6);
        free(*local_60);
        free(pcVar5);
        return 0;
      }
      iVar3 = __isoc99_sscanf(pcVar7,"Content-Length: %d",local_40);
      ppcVar8 = local_60;
      if (iVar3 == 1) {
        recvbuflen = *puVar2;
        if (-1 < (int)recvbuflen) {
          free(pcVar5);
          pcVar5 = (char *)calloc((ulong)recvbuflen + 1,1);
          ppcVar1 = local_48;
          *local_48 = pcVar5;
          if (pcVar5 != (char *)0x0) {
            iVar4 = recvall(local_54,pcVar5,recvbuflen);
            if (iVar4 == 0) {
              *pBytesReceived = *pBytesReceived + *puVar2;
              return 0;
            }
            free(*ppcVar1);
          }
          free(*local_68);
          pcVar5 = *ppcVar8;
          goto LAB_00148280;
        }
      }
      free(*local_68);
    }
    free(*ppcVar8);
  }
  free(pcVar5);
  return 4;
}

Assistant:

inline int recvsimplehttpresp(SOCKET sock, int* pStatus, char** pszStatus, char** pContentType, int* pContentLength, char** pContent, int maxrecvbuflen, int* pBytesReceived)
{
	int ret = EXIT_FAILURE;
	char* recvbuf = NULL;
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	double httpver = 0;

	*pStatus = 0;
	*pszStatus = NULL;
	*pContentType = NULL;
	*pContentLength = 0;
	*pContent = NULL;
	*pBytesReceived = 0;

	recvbuf = (char*)calloc(maxrecvbuflen+1, 1);
	if (recvbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		return EXIT_OUT_OF_MEMORY;
	}

	// Should enable other line endings...

	ret = recvuntilstr(sock, recvbuf, "\r\n\r\n", maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(recvbuf);
		return ret;
	}

	ptr = strstr(recvbuf, "HTTP/");
	if (ptr == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pszStatus = (char*)calloc(256, 1);
	if (*pszStatus == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	if (sscanf(ptr, "HTTP/%lf %d %[^\r\n]255s", &httpver, pStatus, *pszStatus) != 3)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	if (strstrbeginend(ptr, "Content-Type: ", "\r\n", &ptr2, &count) == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pContentType = (char*)calloc(count+1, 1);
	if (*pContentType == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(*pContentType, ptr2, count);

	ptr = strstr(recvbuf, "Content-Length: ");
	if (ptr == NULL)
	{
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_SUCCESS;
	}
	
	if ((sscanf(ptr, "Content-Length: %d", pContentLength) != 1)||(*pContentLength < 0))
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}
	
	free(recvbuf);

	*pContent = (char*)calloc(*pContentLength+1, 1);
	if (*pContent == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		return EXIT_OUT_OF_MEMORY;
	}

	ret = recvall(sock, *pContent, *pContentLength);
	if (ret != EXIT_SUCCESS)
	{
		free(*pContent);
		free(*pContentType);
		free(*pszStatus);
		return ret;
	}

	*pBytesReceived += *pContentLength;

	return EXIT_SUCCESS;
}